

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

lua_Number lj_lib_checknum(lua_State *L,int narg)

{
  int iVar1;
  TValue *o_00;
  TValue *o;
  int narg_local;
  lua_State *L_local;
  
  o_00 = L->base + (long)narg + -1;
  if (o_00 < L->top) {
    if ((uint)((int)(o_00->field_4).it >> 0xf) < 0xfffffff3) {
LAB_001a1138:
      return (lua_Number)o_00->u64;
    }
    if ((int)(o_00->field_4).it >> 0xf == -5) {
      iVar1 = lj_strscan_num((GCstr *)(o_00->u64 & 0x7fffffffffff),o_00);
      if (iVar1 != 0) goto LAB_001a1138;
    }
  }
  lj_err_argt(L,narg,3);
}

Assistant:

lua_Number lj_lib_checknum(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top &&
	(tvisnumber(o) || (tvisstr(o) && lj_strscan_num(strV(o), o)))))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_UNLIKELY(tvisint(o))) {
    lua_Number n = (lua_Number)intV(o);
    setnumV(o, n);
    return n;
  } else {
    return numV(o);
  }
}